

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void lua_replace(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  GCObject *v;
  GCObject *o;
  
  if ((idx == -0x2711) && (L->ci == L->base_ci)) {
    luaG_runerror(L,"no calling environment");
  }
  pTVar2 = index2adr(L,idx);
  if (idx == -0x2711) {
    o = (L->ci->func->value).gc;
    (o->h).array = (TValue *)L->top[-1].value;
    if ((L->top[-1].tt < 4) || (v = L->top[-1].value.gc, ((v->gch).marked & 3) == 0))
    goto LAB_0010ee48;
  }
  else {
    pTVar1 = L->top;
    pTVar2->value = pTVar1[-1].value;
    pTVar2->tt = pTVar1[-1].tt;
    if (((-0x2713 < idx) || (L->top[-1].tt < 4)) ||
       (v = L->top[-1].value.gc, ((v->gch).marked & 3) == 0)) goto LAB_0010ee48;
    o = (L->ci->func->value).gc;
  }
  if (((o->gch).marked & 4) != 0) {
    luaC_barrierf(L,o,v);
  }
LAB_0010ee48:
  L->top = L->top + -1;
  return;
}

Assistant:

static void lua_replace(lua_State*L,int idx){
StkId o;
if(idx==(-10001)&&L->ci==L->base_ci)
luaG_runerror(L,"no calling environment");
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
if(idx==(-10001)){
Closure*func=curr_func(L);
luai_apicheck(L,ttistable(L->top-1));
func->c.env=hvalue(L->top-1);
luaC_barrier(L,func,L->top-1);
}
else{
setobj(L,o,L->top-1);
if(idx<(-10002))
luaC_barrier(L,curr_func(L),L->top-1);
}
L->top--;
}